

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestIterator(void)

{
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *this;
  size_type size;
  exception *e;
  const_iterator iter_1;
  size_t acc;
  InputBuffer ib;
  size_t toWrite;
  const_iterator iter;
  OutputBuffer ob;
  lazy_ostream *in_stack_fffffffffffff6d8;
  char *pcVar3;
  assertion_result *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6e8;
  begin *in_stack_fffffffffffff6f0;
  OutputBuffer *in_stack_fffffffffffff6f8;
  undefined7 in_stack_fffffffffffff700;
  undefined1 in_stack_fffffffffffff707;
  OutputBuffer *in_stack_fffffffffffff708;
  OutputBuffer *in_stack_fffffffffffff710;
  const_string *in_stack_fffffffffffff718;
  const_string *msg;
  size_type in_stack_fffffffffffff720;
  const_string *in_stack_fffffffffffff728;
  undefined6 in_stack_fffffffffffff730;
  undefined1 in_stack_fffffffffffff736;
  undefined1 in_stack_fffffffffffff737;
  begin *in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  size_type local_708;
  basic_cstring<const_char> local_700;
  undefined1 local_6f0 [56];
  basic_cstring<const_char> local_6b8 [3];
  BufferIterator<avro::detail::OutputIteratorHelper> local_688;
  undefined1 local_668 [80];
  difference_type local_618;
  basic_cstring<const_char> local_610;
  undefined1 local_600 [56];
  basic_cstring<const_char> local_5c8 [2];
  assertion_result local_5a8;
  undefined1 local_590 [56];
  basic_cstring<const_char> local_558;
  assertion_result local_548;
  undefined1 local_530 [56];
  basic_cstring<const_char> local_4f8;
  size_type local_4e8;
  basic_cstring<const_char> local_4e0;
  undefined1 local_4d0 [56];
  basic_cstring<const_char> local_498;
  size_type local_488;
  basic_cstring<const_char> local_480;
  undefined1 local_470 [56];
  basic_cstring<const_char> local_438;
  assertion_result local_428;
  basic_cstring<const_char> local_410;
  lazy_ostream local_400 [4];
  assertion_result local_3c0;
  basic_cstring<const_char> local_398;
  size_type local_388;
  basic_cstring<const_char> local_380;
  undefined1 local_370 [56];
  basic_cstring<const_char> local_338;
  size_type local_328;
  basic_cstring<const_char> local_320;
  undefined1 local_310 [56];
  basic_cstring<const_char> local_2d8;
  size_type local_2c8;
  basic_cstring<const_char> local_2c0;
  undefined1 local_2b0 [56];
  basic_cstring<const_char> local_278;
  BufferIterator<avro::detail::OutputIteratorHelper> local_268;
  assertion_result local_244 [2];
  difference_type local_200;
  basic_cstring<const_char> local_1f8;
  undefined1 local_1e8 [56];
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [32];
  undefined1 local_180 [56];
  basic_cstring<const_char> local_148;
  undefined1 local_134 [28];
  undefined1 local_118 [56];
  basic_cstring<const_char> local_e0;
  assertion_result local_d0;
  undefined1 local_b8 [56];
  basic_cstring<const_char> local_80 [5];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffff6f0,(const_string *)in_stack_fffffffffffff6e8,
             (size_t)in_stack_fffffffffffff6e0);
  boost::unit_test::unit_test_log_t::operator<<
            ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             in_stack_fffffffffffff748);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffff6e8,
             (log_level)((ulong)in_stack_fffffffffffff6e0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [13])in_stack_fffffffffffff6e0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]> *)
             0x234c44);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffff6e0);
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
             (size_type)in_stack_fffffffffffff6f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_d0.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_d0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x234d15);
    local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x3;
    local_d0._1_3_ = 0;
    in_stack_fffffffffffff6e8 = "3";
    in_stack_fffffffffffff6e0 = &local_d0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b8,&local_d0.m_message,0x256,1,2,&local_d0.field_0x4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x234d97);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_134 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_134._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x234e6a);
    local_134._0_4_ = 0;
    in_stack_fffffffffffff6e8 = "0U";
    in_stack_fffffffffffff6e0 = (assertion_result *)local_134;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_118,local_134 + 0xc,599,1,2,local_134 + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x234eef);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1a0 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1a0._8_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x234fc2);
    local_1a0._0_8_ = 0x9000;
    in_stack_fffffffffffff6e8 = "2 * kMaxBlockSize + kMinBlockSize";
    in_stack_fffffffffffff6e0 = (assertion_result *)local_1a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_180,local_1a0 + 0x10,600,1,2,local_1a0 + 8,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235048);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    avro::OutputBuffer::begin(in_stack_fffffffffffff708);
    avro::OutputBuffer::end(in_stack_fffffffffffff708);
    local_200 = std::distance<avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>>
                          ((BufferIterator<avro::detail::OutputIteratorHelper> *)
                           CONCAT17(in_stack_fffffffffffff737,
                                    CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
                           (BufferIterator<avro::detail::OutputIteratorHelper> *)
                           in_stack_fffffffffffff728);
    local_244[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x3;
    local_244[0]._1_3_ = 0;
    in_stack_fffffffffffff6e8 = "3";
    in_stack_fffffffffffff6e0 = local_244;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1e8,&local_1f8,0x25a,1,2,&local_200,"std::distance(ob.begin(), ob.end())");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2351d6);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::begin(in_stack_fffffffffffff708);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator->(&local_268);
    local_2c8 = avro::detail::OutputIteratorHelper::size((OutputIteratorHelper *)0x2352d7);
    in_stack_fffffffffffff6e8 = "kMaxBlockSize";
    in_stack_fffffffffffff6e0 = (assertion_result *)&avro::detail::kMaxBlockSize;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2b0,&local_2c0,0x25d,1,2,&local_2c8,"iter->size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235350);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator++
            ((BufferIterator<avro::detail::OutputIteratorHelper> *)in_stack_fffffffffffff6e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator->(&local_268);
    local_328 = avro::detail::OutputIteratorHelper::size((OutputIteratorHelper *)0x235449);
    in_stack_fffffffffffff6e8 = "kMaxBlockSize";
    in_stack_fffffffffffff6e0 = (assertion_result *)&avro::detail::kMaxBlockSize;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_310,&local_320,0x25f,1,2,&local_328,"iter->size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2354c2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator++
            ((BufferIterator<avro::detail::OutputIteratorHelper> *)in_stack_fffffffffffff6e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator->(&local_268);
    local_388 = avro::detail::OutputIteratorHelper::size((OutputIteratorHelper *)0x2355bb);
    in_stack_fffffffffffff6e8 = "kMinBlockSize";
    in_stack_fffffffffffff6e0 = (assertion_result *)&avro::detail::kMinBlockSize;
    pcVar3 = "iter->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_370,&local_380,0x261,1,2,&local_388);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235634);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator++
            ((BufferIterator<avro::detail::OutputIteratorHelper> *)in_stack_fffffffffffff6e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    avro::OutputBuffer::end(in_stack_fffffffffffff708);
    avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator==
              ((BufferIterator<avro::detail::OutputIteratorHelper> *)in_stack_fffffffffffff6e0,
               (this_type *)pcVar3);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6e0,SUB81((ulong)pcVar3 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,"iter == ob.end()",0x10);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_428.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    pcVar3 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3c0,local_400,(const_string *)&local_428.m_message,0x263,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x2357bd);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x2357ca);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_428.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_428._1_7_ = 0x50;
  avro::OutputBuffer::wroteTo(in_stack_fffffffffffff710,(size_type)in_stack_fffffffffffff708);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_488 = avro::OutputBuffer::size((OutputBuffer *)0x2358c0);
    in_stack_fffffffffffff6e8 = "toWrite";
    in_stack_fffffffffffff6e0 = &local_428;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_470,&local_480,0x267,1,2,&local_488,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23593a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_4e8 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x235a0d);
    in_stack_fffffffffffff6e8 = "kMaxBlockSize";
    in_stack_fffffffffffff6e0 = (assertion_result *)&avro::detail::kMaxBlockSize;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_4d0,&local_4e0,0x268,1,2,&local_4e8,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235a86);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_548.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_548._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x235b59);
    local_548.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x2;
    local_548._1_3_ = 0;
    in_stack_fffffffffffff6e8 = "2";
    in_stack_fffffffffffff6e0 = &local_548;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_530,&local_548.m_message,0x269,1,2,&local_548.field_0x4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235bdb);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_5a8.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_5a8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x235cae);
    local_5a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x2;
    local_5a8._1_3_ = 0;
    in_stack_fffffffffffff6e8 = "2";
    in_stack_fffffffffffff6e0 = &local_5a8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_590,&local_5a8.m_message,0x26a,1,2,&local_5a8.field_0x4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235d2a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::InputBuffer::InputBuffer
            ((InputBuffer *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
             in_stack_fffffffffffff6f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_5c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,
                        CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_610,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    avro::InputBuffer::begin((InputBuffer *)in_stack_fffffffffffff708);
    avro::InputBuffer::end((InputBuffer *)in_stack_fffffffffffff708);
    local_618 = std::distance<avro::detail::BufferIterator<avro::detail::InputIteratorHelper>>
                          ((BufferIterator<avro::detail::InputIteratorHelper> *)
                           CONCAT17(in_stack_fffffffffffff737,
                                    CONCAT16(in_stack_fffffffffffff736,in_stack_fffffffffffff730)),
                           (BufferIterator<avro::detail::InputIteratorHelper> *)
                           in_stack_fffffffffffff728);
    local_668._12_4_ = 2;
    in_stack_fffffffffffff6e8 = "2";
    in_stack_fffffffffffff6e0 = (assertion_result *)(local_668 + 0xc);
    pcVar3 = "std::distance(ib.begin(), ib.end())";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_600,&local_610,0x26d,1,2,&local_618);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x235eb7);
    in_stack_fffffffffffff737 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff737);
  local_668._0_8_ = 0;
  avro::OutputBuffer::begin(in_stack_fffffffffffff708);
  while( true ) {
    avro::OutputBuffer::end(in_stack_fffffffffffff708);
    uVar2 = avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator!=
                      ((BufferIterator<avro::detail::OutputIteratorHelper> *)
                       in_stack_fffffffffffff6e0,(this_type *)pcVar3);
    if (!(bool)uVar2) break;
    in_stack_fffffffffffff728 =
         (const_string *)
         avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator->(&local_688);
    in_stack_fffffffffffff720 =
         avro::detail::OutputIteratorHelper::size((OutputIteratorHelper *)0x235f52);
    local_668._0_8_ = in_stack_fffffffffffff720 + local_668._0_8_;
    avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>::operator++
              ((BufferIterator<avro::detail::OutputIteratorHelper> *)in_stack_fffffffffffff6e0);
  }
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_6b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffff737,CONCAT16(uVar2,in_stack_fffffffffffff730)),
               in_stack_fffffffffffff728,in_stack_fffffffffffff720,msg);
    this = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6e8,(char (*) [1])in_stack_fffffffffffff6e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_700,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    size = avro::OutputBuffer::freeSpace((OutputBuffer *)0x2362b6);
    in_stack_fffffffffffff6e8 = "acc";
    in_stack_fffffffffffff6e0 = (assertion_result *)local_668;
    local_708 = size;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_6f0,&local_700,0x275,1,2,&local_708,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23632a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::wroteTo((OutputBuffer *)this,size);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23642d);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23643a);
  return;
}

Assistant:

void TestIterator() 
{
    BOOST_TEST_MESSAGE( "TestIterator");
    {
        OutputBuffer ob(2 * kMaxBlockSize + 10);
        BOOST_CHECK_EQUAL(ob.numChunks(), 3);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 2 * kMaxBlockSize + kMinBlockSize);

        BOOST_CHECK_EQUAL (std::distance(ob.begin(), ob.end()), 3);

        OutputBuffer::const_iterator iter = ob.begin();
        BOOST_CHECK_EQUAL( iter->size(), kMaxBlockSize);
        ++iter;
        BOOST_CHECK_EQUAL( iter->size(), kMaxBlockSize);
        ++iter;
        BOOST_CHECK_EQUAL( iter->size(), kMinBlockSize);
        ++iter;
        BOOST_CHECK( iter == ob.end());

        size_t toWrite = kMaxBlockSize + kMinBlockSize;
        ob.wroteTo(toWrite);
        BOOST_CHECK_EQUAL(ob.size(), toWrite);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kMaxBlockSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        InputBuffer ib = ob;
        BOOST_CHECK_EQUAL (std::distance(ib.begin(), ib.end()), 2);

        size_t acc = 0;
        for(OutputBuffer::const_iterator iter = ob.begin();
            iter != ob.end(); 
            ++iter) {
            acc += iter->size();
        }
        BOOST_CHECK_EQUAL(ob.freeSpace(), acc);

        try {
            ob.wroteTo(acc+1);
        }
        catch (std::exception &e) {
            std::cout << "Intentionally triggered exception: " << e.what() << std::endl; 
        }
    }
}